

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O2

void __thiscall BinHash<IPAsKeyLRU>::Clear(BinHash<IPAsKeyLRU> *this)

{
  IPAsKeyLRU *pIVar1;
  IPAsKeyLRU *x;
  IPAsKeyLRU **ppIVar2;
  uint32_t i;
  ulong uVar3;
  
  ppIVar2 = this->hashBin;
  if (ppIVar2 != (IPAsKeyLRU **)0x0) {
    for (uVar3 = 0; uVar3 < this->tableSize; uVar3 = uVar3 + 1) {
      while (pIVar1 = ppIVar2[uVar3], pIVar1 != (IPAsKeyLRU *)0x0) {
        ppIVar2[uVar3] = pIVar1->HashNext;
        (*(pIVar1->super_IPAsKey)._vptr_IPAsKey[1])(pIVar1);
        ppIVar2 = this->hashBin;
      }
    }
    operator_delete__(ppIVar2);
    this->hashBin = (IPAsKeyLRU **)0x0;
  }
  this->tableSize = 0;
  this->tableCount = 0;
  return;
}

Assistant:

void Clear()
    {
        if (hashBin != NULL)
        {
            for (uint32_t i = 0; i < tableSize; i++)
            {
                while (hashBin[i] != NULL)
                {
                    KeyObj *x = hashBin[i];
                    hashBin[i] = x->HashNext;
                    delete x;
                }
            }

            delete[] hashBin;
            hashBin = NULL;
        }

        tableCount = 0;
        tableSize = 0;
    }